

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O0

void duckdb::BitwiseOperation::Combine<duckdb::BitState<duckdb::uhugeint_t>,duckdb::BitOrOperation>
               (BitState<duckdb::uhugeint_t> *source,BitState<duckdb::uhugeint_t> *target,
               AggregateInputData *param_3)

{
  uhugeint_t input;
  BitwiseOperation *in_RSI;
  byte *in_RDI;
  uhugeint_t input_00;
  uint64_t in_stack_ffffffffffffffd8;
  uint64_t in_stack_ffffffffffffffe0;
  
  if ((*in_RDI & 1) != 0) {
    if (((byte)*in_RSI & 1) == 0) {
      input_00.upper = (uint64_t)*(BitState<duckdb::uhugeint_t> **)(in_RDI + 8);
      input_00.lower = *(uint64_t *)(in_RDI + 0x10);
      Assign<duckdb::uhugeint_t,duckdb::BitState<duckdb::uhugeint_t>>
                (in_RSI,*(BitState<duckdb::uhugeint_t> **)(in_RDI + 8),input_00);
      *in_RSI = (BitwiseOperation)0x1;
    }
    else {
      input.upper = in_stack_ffffffffffffffe0;
      input.lower = in_stack_ffffffffffffffd8;
      BitOrOperation::Execute<duckdb::uhugeint_t,duckdb::BitState<duckdb::uhugeint_t>>
                (*(BitState<duckdb::uhugeint_t> **)(in_RDI + 0x10),input);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			// source is NULL, nothing to do.
			return;
		}
		if (!target.is_set) {
			// target is NULL, use source value directly.
			OP::template Assign<typename STATE::TYPE>(target, source.value);
			target.is_set = true;
		} else {
			OP::template Execute<typename STATE::TYPE>(target, source.value);
		}
	}